

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestCopy(void)

{
  size_type sVar1;
  element_type *peVar2;
  BufferReader *pBVar3;
  InputBuffer *pIVar4;
  OutputBuffer *pOVar5;
  shared_count *this;
  int iVar6;
  bool bVar7;
  OutputBuffer wb;
  undefined8 local_950;
  size_type local_948;
  InputBuffer ib;
  size_type bufsize;
  OutputBuffer wb_3;
  string msg;
  BufferReader local_8e8;
  char *local_8a0;
  char *local_898;
  const_string local_890;
  const_string local_880;
  char *local_870;
  char *local_868;
  const_string local_860;
  const_string local_850;
  char *local_840;
  char *local_838;
  const_string local_830;
  const_string local_820;
  char *local_810;
  char *local_808;
  const_string local_800;
  const_string local_7f0;
  char *local_7e0;
  char *local_7d8;
  const_string local_7d0;
  const_string local_7c0;
  char *local_7b0;
  char *local_7a8;
  const_string local_7a0;
  const_string local_790;
  char *local_780;
  char *local_778;
  const_string local_770;
  const_string local_760;
  char *local_750;
  char *local_748;
  const_string local_740;
  const_string local_730;
  char *local_720;
  char *local_718;
  const_string local_710;
  const_string local_700;
  char *local_6f0;
  char *local_6e8;
  const_string local_6e0;
  const_string local_6d0;
  char *local_6c0;
  char *local_6b8;
  const_string local_6b0;
  const_string local_6a0;
  char *local_690;
  char *local_688;
  const_string local_680;
  const_string local_670;
  char *local_660;
  char *local_658;
  const_string local_650;
  const_string local_640;
  char *local_630;
  char *local_628;
  const_string local_620;
  const_string local_610;
  char *local_600;
  char *local_5f8;
  const_string local_5f0;
  const_string local_5e0;
  char *local_5d0;
  char *local_5c8;
  const_string local_5c0;
  const_string local_5b0;
  char *local_5a0;
  char *local_598;
  const_string local_590;
  const_string local_580;
  char *local_570;
  char *local_568;
  const_string local_560;
  const_string local_550;
  char *local_540;
  char *local_538;
  const_string local_530;
  const_string local_520;
  char *local_510;
  char *local_508;
  const_string local_500;
  const_string local_4f0;
  char *local_4e0;
  char *local_4d8;
  const_string local_4d0;
  const_string local_4c0;
  char *local_4b0;
  char *local_4a8;
  const_string local_4a0;
  const_string local_490;
  char *local_480;
  char *local_478;
  const_string local_470;
  const_string local_460;
  char *local_450;
  char *local_448;
  const_string local_440;
  const_string local_430;
  char *local_420;
  char *local_418;
  const_string local_410;
  const_string local_400;
  char *local_3f0;
  char *local_3e8;
  const_string local_3e0;
  const_string local_3d0;
  char *local_3c0;
  char *local_3b8;
  const_string local_3b0;
  const_string local_3a0;
  char *local_390;
  char *local_388;
  const_string local_380;
  const_string local_370;
  char *local_360;
  char *local_358;
  const_string local_350;
  const_string local_340;
  char *local_330;
  char *local_328;
  const_string local_320;
  const_string local_310;
  char *local_300;
  char *local_2f8;
  const_string local_2f0;
  const_string local_2e0;
  char *local_2d0;
  char *local_2c8;
  const_string local_2c0;
  const_string local_2b0;
  char *local_2a0;
  char *local_298;
  const_string local_290;
  const_string local_280;
  char *local_270;
  char *local_268;
  const_string local_260;
  const_string local_250;
  char *local_240;
  char *local_238;
  const_string local_230;
  const_string local_220;
  char *local_210;
  char *local_208;
  const_string local_200;
  const_string local_1f0;
  char *local_1e0;
  char *local_1d8;
  const_string local_1d0;
  const_string local_1c0;
  char *local_1b0;
  char *local_1a8;
  const_string local_1a0;
  const_string local_190;
  char *local_180;
  char *local_178;
  const_string local_170;
  const_string local_160;
  char *local_150;
  char *local_148;
  const_string local_140;
  const_string local_130;
  char *local_120;
  char *local_118;
  const_string local_110;
  const_string local_100;
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  char *local_c0;
  char *local_b8;
  const_string local_b0;
  const_string local_a0;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  msg._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  msg._M_string_length =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  msg.field_2._M_allocated_capacity = 0x34d;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&msg);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  wb_3.pimpl_.px = (element_type *)CONCAT71(wb_3.pimpl_.px._1_7_,1);
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea948;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1ba84d;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&wb_3,(lazy_ostream *)&local_8e8);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&wb_3);
  makeString_abi_cxx11_(&msg,0x1e);
  std::operator<<((ostream *)&std::cout,"Test1\n");
  avro::OutputBuffer::OutputBuffer(&wb,0);
  peVar2 = wb.pimpl_.px;
  avro::detail::BufferImpl::writeTo(wb.pimpl_.px,msg._M_dataplus._M_p,msg._M_string_length);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)peVar2,&local_40,0x358,&local_50);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_58 = "";
  wb_3.pimpl_.px = (element_type *)msg._M_string_length;
  ib.pimpl_.px = (element_type *)(wb.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (pBVar3,&local_60,0x358,1,2,&wb_3,"msg.size()",&ib,"wb.size()");
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_70,0x359,&local_80);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->readChunks_);
  wb_3.pimpl_.px = (element_type *)CONCAT44(wb_3.pimpl_.px._4_4_,(int)sVar1);
  ib.pimpl_.px = (element_type *)CONCAT44(ib.pimpl_.px._4_4_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pBVar3,&local_90,0x359,1,2,&wb_3,"wb.numDataChunks()",&ib,"1");
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_a0,0x35b,&local_b0);
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_b8 = "";
  wb_3.pimpl_.px = (element_type *)(0x1000 - msg._M_string_length);
  ib.pimpl_.px = (element_type *)(wb.pimpl_.px)->freeSpace_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_8e8,&local_c0,0x35b,1,2,&wb_3,"kDefaultBlockSize - msg.size()",&ib,
             "wb.freeSpace()");
  local_8e8.bufferImpl_.px = wb.pimpl_.px;
  local_8e8.bufferImpl_.pn.pi_ = wb.pimpl_.pn.pi_;
  if (wb.pimpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (wb.pimpl_.pn.pi_)->use_count_ = (wb.pimpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_8e8.iter_._M_cur =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_8e8.iter_._M_first =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_8e8.iter_._M_last =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_8e8.iter_._M_node =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_8e8.bytes_ = (wb.pimpl_.px)->size_;
  local_8e8.chunkPos_ = 0;
  local_8e8.bytesRemaining_ = local_8e8.bytes_;
  avro::BufferReader::seek(&local_8e8,5);
  avro::BufferReader::copyData((BufferReader *)&ib,(size_type)&local_8e8);
  pIVar4 = &ib;
  printBuffer(pIVar4);
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pIVar4,&local_d0,0x364,&local_e0);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_e8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ib.pimpl_.px)->readChunks_);
  bufsize = CONCAT44(bufsize._4_4_,(int)sVar1);
  local_950 = CONCAT44(local_950._4_4_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pOVar5,&local_f0,0x364,1,2,&bufsize,"ib.numChunks()",&local_950,"1");
  local_100.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_100.m_end = "";
  local_110.m_begin = "";
  local_110.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_100,0x365,&local_110);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_118 = "";
  bufsize = (ib.pimpl_.px)->size_;
  local_950 = msg._M_string_length - 10;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (pOVar5,&local_120,0x365,1,2,&bufsize,"ib.size()",&local_950,"msg.size()-10");
  local_130.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_130.m_end = "";
  local_140.m_begin = "";
  local_140.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_130,0x368,&local_140);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_148 = "";
  bufsize = msg._M_string_length;
  local_950 = (wb.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (pOVar5,&local_150,0x368,1,2,&bufsize,"msg.size()",&local_950,"wb.size()");
  local_160.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_160.m_end = "";
  local_170.m_begin = "";
  local_170.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_160,0x369,&local_170);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_178 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->readChunks_);
  bufsize = CONCAT44(bufsize._4_4_,(int)sVar1);
  local_950 = CONCAT44(local_950._4_4_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pOVar5,&local_180,0x369,1,2,&bufsize,"wb.numDataChunks()",&local_950,"1");
  local_190.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_190.m_end = "";
  local_1a0.m_begin = "";
  local_1a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_190,0x36b,&local_1a0);
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1a8 = "";
  bufsize = 0x1000 - msg._M_string_length;
  local_950 = (wb.pimpl_.px)->freeSpace_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&wb_3,&local_1b0,0x36b,1,2,&bufsize,"kDefaultBlockSize - msg.size()",&local_950,
             "wb.freeSpace()");
  peVar2 = wb.pimpl_.px;
  avro::detail::BufferImpl::reserveFreeSpace(wb.pimpl_.px,0x1000);
  local_1c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1c0.m_end = "";
  local_1d0.m_begin = "";
  local_1d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)peVar2,&local_1c0,0x36f,&local_1d0);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1d8 = "";
  bufsize = (wb.pimpl_.px)->size_;
  local_950 = msg._M_string_length;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (pOVar5,&local_1e0,0x36f,1,2,&bufsize,"wb.size()",&local_950,"msg.size()");
  local_1f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1f0.m_end = "";
  local_200.m_begin = "";
  local_200.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_1f0,0x370,&local_200);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_208 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->writeChunks_);
  bufsize = CONCAT44(bufsize._4_4_,(int)sVar1);
  local_950 = CONCAT44(local_950._4_4_,2);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pOVar5,&local_210,0x370,1,2,&bufsize,"wb.numChunks()",&local_950,"2");
  local_220.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_220.m_end = "";
  local_230.m_begin = "";
  local_230.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_220,0x372,&local_230);
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_238 = "";
  bufsize = 0x2000 - msg._M_string_length;
  local_950 = (wb.pimpl_.px)->freeSpace_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&wb_3,&local_240,0x372,1,2,&bufsize,"kDefaultBlockSize * 2 - msg.size()",&local_950,
             "wb.freeSpace()");
  boost::detail::shared_count::~shared_count(&ib.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&local_8e8.bufferImpl_.pn);
  boost::detail::shared_count::~shared_count(&wb.pimpl_.pn);
  std::operator<<((ostream *)&std::cout,"Test2\n");
  bufsize = 0xc000;
  pOVar5 = &wb;
  avro::OutputBuffer::OutputBuffer(pOVar5,0xc000);
  local_250.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_250.m_end = "";
  local_260.m_begin = "";
  local_260.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_250,0x37c,&local_260);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_268 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->writeChunks_);
  wb_3.pimpl_.px = (element_type *)CONCAT44(wb_3.pimpl_.px._4_4_,(int)sVar1);
  ib.pimpl_.px = (element_type *)CONCAT44(ib.pimpl_.px._4_4_,3);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pBVar3,&local_270,0x37c,1,2,&wb_3,"wb.numChunks()",&ib,"3");
  local_280.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_280.m_end = "";
  local_290.m_begin = "";
  local_290.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_280,0x37d,&local_290);
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_298 = "";
  wb_3.pimpl_.px = (element_type *)(wb.pimpl_.px)->freeSpace_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_8e8,&local_2a0,0x37d,1,2,&wb_3,"wb.freeSpace()",&bufsize,"bufsize");
  peVar2 = wb.pimpl_.px;
  avro::detail::BufferImpl::writeTo(wb.pimpl_.px,msg._M_dataplus._M_p,msg._M_string_length);
  local_2b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2b0.m_end = "";
  local_2c0.m_begin = "";
  local_2c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)peVar2,&local_2b0,0x381,&local_2c0);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2c8 = "";
  wb_3.pimpl_.px = (element_type *)(wb.pimpl_.px)->size_;
  ib.pimpl_.px = (element_type *)msg._M_string_length;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (pBVar3,&local_2d0,0x381,1,2,&wb_3,"wb.size()",&ib,"msg.size()");
  local_2e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2e0.m_end = "";
  local_2f0.m_begin = "";
  local_2f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_2e0,0x382,&local_2f0);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2f8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->readChunks_);
  wb_3.pimpl_.px = (element_type *)CONCAT44(wb_3.pimpl_.px._4_4_,(int)sVar1);
  ib.pimpl_.px = (element_type *)CONCAT44(ib.pimpl_.px._4_4_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pBVar3,&local_300,0x382,1,2,&wb_3,"wb.numDataChunks()",&ib,"1");
  local_310.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_310.m_end = "";
  local_320.m_begin = "";
  local_320.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_310,900,&local_320);
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_328 = "";
  wb_3.pimpl_.px = (element_type *)(0xc000 - msg._M_string_length);
  ib.pimpl_.px = (element_type *)(wb.pimpl_.px)->freeSpace_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_8e8,&local_330,900,1,2,&wb_3,"bufsize - msg.size()",&ib,"wb.freeSpace()");
  local_8e8.bufferImpl_.px = wb.pimpl_.px;
  local_8e8.bufferImpl_.pn.pi_ = wb.pimpl_.pn.pi_;
  if (wb.pimpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (wb.pimpl_.pn.pi_)->use_count_ = (wb.pimpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_8e8.iter_._M_cur =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_8e8.iter_._M_first =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_8e8.iter_._M_last =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_8e8.iter_._M_node =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_8e8.bytes_ = (wb.pimpl_.px)->size_;
  local_8e8.chunkPos_ = 0;
  local_8e8.bytesRemaining_ = local_8e8.bytes_;
  avro::BufferReader::seek(&local_8e8,5);
  avro::BufferReader::copyData((BufferReader *)&ib,(size_type)&local_8e8);
  pIVar4 = &ib;
  printBuffer(pIVar4);
  local_340.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_340.m_end = "";
  local_350.m_begin = "";
  local_350.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pIVar4,&local_340,0x38c,&local_350);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_358 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ib.pimpl_.px)->readChunks_);
  local_950 = CONCAT44(local_950._4_4_,(int)sVar1);
  local_948 = CONCAT44(local_948._4_4_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pOVar5,&local_360,0x38c,1,2,&local_950,"ib.numChunks()",&local_948,"1");
  local_370.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_370.m_end = "";
  local_380.m_begin = "";
  local_380.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_370,0x38d,&local_380);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_388 = "";
  local_950 = (ib.pimpl_.px)->size_;
  local_948 = msg._M_string_length - 10;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (pOVar5,&local_390,0x38d,1,2,&local_950,"ib.size()",&local_948,"msg.size()-10");
  local_3a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3a0.m_end = "";
  local_3b0.m_begin = "";
  local_3b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_3a0,0x390,&local_3b0);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3b8 = "";
  local_950 = msg._M_string_length;
  local_948 = (wb.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (pOVar5,&local_3c0,0x390,1,2,&local_950,"msg.size()",&local_948,"wb.size()");
  local_3d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3d0.m_end = "";
  local_3e0.m_begin = "";
  local_3e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_3d0,0x391,&local_3e0);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3e8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->writeChunks_);
  local_948._0_4_ = 3;
  local_950._0_4_ = (int)sVar1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pOVar5,&local_3f0,0x391,1,2,&local_950,"wb.numChunks()",&local_948,"3");
  local_400.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_400.m_end = "";
  local_410.m_begin = "";
  local_410.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_400,0x392,&local_410);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_418 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->readChunks_);
  local_950 = CONCAT44(local_950._4_4_,(int)sVar1);
  local_948 = CONCAT44(local_948._4_4_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pOVar5,&local_420,0x392,1,2,&local_950,"wb.numDataChunks()",&local_948,"1");
  local_430.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_430.m_end = "";
  local_440.m_begin = "";
  local_440.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_430,0x393,&local_440);
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_448 = "";
  local_950 = 0xc000 - msg._M_string_length;
  local_948 = (wb.pimpl_.px)->freeSpace_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&wb_3,&local_450,0x393,1,2,&local_950,"bufsize - msg.size()",&local_948,
             "wb.freeSpace()");
  peVar2 = wb.pimpl_.px;
  avro::detail::BufferImpl::reserveFreeSpace(wb.pimpl_.px,1);
  local_460.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_460.m_end = "";
  local_470.m_begin = "";
  local_470.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)peVar2,&local_460,0x397,&local_470);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_478 = "";
  local_950 = msg._M_string_length;
  local_948 = (wb.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (pOVar5,&local_480,0x397,1,2,&local_950,"msg.size()",&local_948,"wb.size()");
  local_490.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_490.m_end = "";
  local_4a0.m_begin = "";
  local_4a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_490,0x398,&local_4a0);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_4a8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->writeChunks_);
  local_950 = CONCAT44(local_950._4_4_,(int)sVar1);
  local_948 = CONCAT44(local_948._4_4_,3);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pOVar5,&local_4b0,0x398,1,2,&local_950,"wb.numChunks()",&local_948,"3");
  local_4c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_4c0.m_end = "";
  local_4d0.m_begin = "";
  local_4d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_4c0,0x399,&local_4d0);
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_4d8 = "";
  local_950 = 0xc000 - msg._M_string_length;
  local_948 = (wb.pimpl_.px)->freeSpace_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&wb_3,&local_4e0,0x399,1,2,&local_950,"bufsize - msg.size()",&local_948,
             "wb.freeSpace()");
  peVar2 = wb.pimpl_.px;
  avro::detail::BufferImpl::reserveFreeSpace(wb.pimpl_.px,0xc000);
  local_4f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_4f0.m_end = "";
  local_500.m_begin = "";
  local_500.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)peVar2,&local_4f0,0x39d,&local_500);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_508 = "";
  local_950 = msg._M_string_length;
  local_948 = (wb.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (pOVar5,&local_510,0x39d,1,2,&local_950,"msg.size()",&local_948,"wb.size()");
  local_520.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_520.m_end = "";
  local_530.m_begin = "";
  local_530.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_520,0x39e,&local_530);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_538 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->writeChunks_);
  local_950 = CONCAT44(local_950._4_4_,(int)sVar1);
  local_948 = CONCAT44(local_948._4_4_,4);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pOVar5,&local_540,0x39e,1,2,&local_950,"wb.numChunks()",&local_948,"4");
  local_550.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_550.m_end = "";
  local_560.m_begin = "";
  local_560.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_550,0x3a0,&local_560);
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_568 = "";
  local_950 = 0xd000 - msg._M_string_length;
  local_948 = (wb.pimpl_.px)->freeSpace_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&wb_3,&local_570,0x3a0,1,2,&local_950,"kMaxBlockSize * 3 - msg.size() + kMinBlockSize",
             &local_948,"wb.freeSpace()");
  boost::detail::shared_count::~shared_count(&ib.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&local_8e8.bufferImpl_.pn);
  boost::detail::shared_count::~shared_count(&wb.pimpl_.pn);
  std::operator<<((ostream *)&std::cout,"Test3\n");
  bufsize = 0x2000;
  pOVar5 = &wb;
  avro::OutputBuffer::OutputBuffer(pOVar5,0);
  iVar6 = 0x2000;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    pOVar5 = &wb;
    avro::OutputBuffer::writeTo<char>(&wb,'a');
  }
  local_580.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_580.m_end = "";
  local_590.m_begin = "";
  local_590.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_580,0x3ad,&local_590);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_598 = "";
  wb_3.pimpl_.px = (element_type *)(wb.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (pBVar3,&local_5a0,0x3ad,1,2,&wb_3,"wb.size()",&bufsize,"bufsize");
  local_5b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_5b0.m_end = "";
  local_5c0.m_begin = "";
  local_5c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_5b0,0x3ae,&local_5c0);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_5c8 = "";
  wb_3.pimpl_.px = (element_type *)(wb.pimpl_.px)->freeSpace_;
  ib.pimpl_.px = (element_type *)((ulong)ib.pimpl_.px & 0xffffffff00000000);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (pBVar3,&local_5d0,0x3ae,1,2,&wb_3,"wb.freeSpace()",&ib,"0U");
  local_5e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_5e0.m_end = "";
  local_5f0.m_begin = "";
  local_5f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_5e0,0x3af,&local_5f0);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_5f8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->writeChunks_);
  wb_3.pimpl_.px = (element_type *)CONCAT44(wb_3.pimpl_.px._4_4_,(int)sVar1);
  ib.pimpl_.px = (element_type *)((ulong)ib.pimpl_.px & 0xffffffff00000000);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pBVar3,&local_600,0x3af,1,2,&wb_3,"wb.numChunks()",&ib,"0");
  local_610.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_610.m_end = "";
  local_620.m_begin = "";
  local_620.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_610,0x3b0,&local_620);
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_628 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->readChunks_);
  wb_3.pimpl_.px = (element_type *)CONCAT44(wb_3.pimpl_.px._4_4_,(int)sVar1);
  ib.pimpl_.px = (element_type *)CONCAT44(ib.pimpl_.px._4_4_,2);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_8e8,&local_630,0x3b0,1,2,&wb_3,"wb.numDataChunks()",&ib,"2");
  local_8e8.bufferImpl_.px = wb.pimpl_.px;
  local_8e8.bufferImpl_.pn.pi_ = wb.pimpl_.pn.pi_;
  if (wb.pimpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (wb.pimpl_.pn.pi_)->use_count_ = (wb.pimpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_8e8.iter_._M_cur =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_8e8.iter_._M_first =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_8e8.iter_._M_last =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_8e8.iter_._M_node =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_8e8.bytes_ = (wb.pimpl_.px)->size_;
  local_8e8.chunkPos_ = 0;
  local_8e8.bytesRemaining_ = local_8e8.bytes_;
  avro::BufferReader::seek(&local_8e8,0xff6);
  avro::BufferReader::copyData((BufferReader *)&ib,(size_type)&local_8e8);
  pIVar4 = &ib;
  printBuffer(pIVar4);
  local_640.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_640.m_end = "";
  local_650.m_begin = "";
  local_650.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pIVar4,&local_640,0x3b9,&local_650);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_658 = "";
  local_950 = (ib.pimpl_.px)->size_;
  local_948._0_4_ = 0x14;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (pOVar5,&local_660,0x3b9,1,2,&local_950,"ib.size()",&local_948,"20U");
  local_670.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_670.m_end = "";
  local_680.m_begin = "";
  local_680.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_670,0x3ba,&local_680);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_688 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ib.pimpl_.px)->readChunks_);
  local_950 = CONCAT44(local_950._4_4_,(int)sVar1);
  local_948._0_4_ = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pOVar5,&local_690,0x3ba,1,2,&local_950,"ib.numChunks()",&local_948,"2");
  local_6a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_6a0.m_end = "";
  local_6b0.m_begin = "";
  local_6b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_6a0,0x3bd,&local_6b0);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_6b8 = "";
  local_950 = (wb.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (pOVar5,&local_6c0,0x3bd,1,2,&local_950,"wb.size()",&bufsize,"bufsize");
  local_6d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_6d0.m_end = "";
  local_6e0.m_begin = "";
  local_6e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_6d0,0x3be,&local_6e0);
  pOVar5 = &wb_3;
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_6e8 = "";
  local_950 = (wb.pimpl_.px)->freeSpace_;
  local_948._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (pOVar5,&local_6f0,0x3be,1,2,&local_950,"wb.freeSpace()",&local_948,"0U");
  local_700.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_700.m_end = "";
  local_710.m_begin = "";
  local_710.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_700,0x3bf,&local_710);
  wb_3.pimpl_.pn.pi_._0_1_ = 0;
  wb_3.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_718 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->readChunks_);
  local_948 = CONCAT44(local_948._4_4_,2);
  local_950._0_4_ = (int)sVar1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&wb_3,&local_720,0x3bf,1,2,&local_950,"wb.numDataChunks()",&local_948,"2");
  boost::detail::shared_count::~shared_count(&ib.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&local_8e8.bufferImpl_.pn);
  boost::detail::shared_count::~shared_count(&wb.pimpl_.pn);
  bufsize = 0x8000;
  std::operator<<((ostream *)&std::cout,"Test4\n");
  pOVar5 = &wb_3;
  avro::OutputBuffer::OutputBuffer(pOVar5,0x8000);
  local_730.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_730.m_end = "";
  local_740.m_begin = "";
  local_740.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar5,&local_730,0x3c7,&local_740);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_748 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb_3.pimpl_.px)->writeChunks_);
  wb.pimpl_.px = (element_type *)CONCAT44(wb.pimpl_.px._4_4_,(int)sVar1);
  ib.pimpl_.px = (element_type *)CONCAT44(ib.pimpl_.px._4_4_,2);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pBVar3,&local_750,0x3c7,1,2,&wb,"wb.numChunks()",&ib,"2");
  local_760.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_760.m_end = "";
  local_770.m_begin = "";
  local_770.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_760,0x3c8,&local_770);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_778 = "";
  wb.pimpl_.px = (element_type *)(wb_3.pimpl_.px)->size_;
  ib.pimpl_.px = (element_type *)((ulong)ib.pimpl_.px & 0xffffffff00000000);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (pBVar3,&local_780,0x3c8,1,2,&wb,"wb.size()",&ib,"0U");
  local_790.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_790.m_end = "";
  local_7a0.m_begin = "";
  local_7a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_790,0x3c9,&local_7a0);
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_7a8 = "";
  wb.pimpl_.px = (element_type *)(wb_3.pimpl_.px)->freeSpace_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_8e8,&local_7b0,0x3c9,1,2,&wb,"wb.freeSpace()",&bufsize,"bufsize");
  avro::InputBuffer::InputBuffer((InputBuffer *)&wb);
  local_8e8.bufferImpl_.pn.pi_ =
       (sp_counted_base *)CONCAT71(wb_3.pimpl_.pn.pi_._1_7_,wb_3.pimpl_.pn.pi_._0_1_);
  local_8e8.bufferImpl_.px = wb_3.pimpl_.px;
  if (local_8e8.bufferImpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_8e8.bufferImpl_.pn.pi_)->use_count_ = (local_8e8.bufferImpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_8e8.iter_._M_cur =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_8e8.iter_._M_first =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_8e8.iter_._M_last =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_8e8.iter_._M_node =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_8e8.bytes_ = (wb_3.pimpl_.px)->size_;
  local_8e8.chunkPos_ = 0;
  local_8e8.bytesRemaining_ = local_8e8.bytes_;
  avro::BufferReader::seek(&local_8e8,10);
  boost::detail::shared_count::~shared_count(&local_8e8.bufferImpl_.pn);
  local_8e8.bufferImpl_.pn.pi_ =
       (sp_counted_base *)CONCAT71(wb_3.pimpl_.pn.pi_._1_7_,wb_3.pimpl_.pn.pi_._0_1_);
  local_8e8.bufferImpl_.px = wb_3.pimpl_.px;
  if (local_8e8.bufferImpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_8e8.bufferImpl_.pn.pi_)->use_count_ = (local_8e8.bufferImpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  this = &local_8e8.bufferImpl_.pn;
  local_8e8.iter_._M_cur =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_8e8.iter_._M_first =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_8e8.iter_._M_last =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_8e8.iter_._M_node =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_8e8.bytes_ = (wb_3.pimpl_.px)->size_;
  local_8e8.chunkPos_ = 0;
  local_8e8.bytesRemaining_ = local_8e8.bytes_;
  avro::BufferReader::copyData((BufferReader *)&ib,(size_type)&local_8e8);
  boost::detail::shared_count::~shared_count(&ib.pimpl_.pn);
  boost::detail::shared_count::~shared_count(this);
  local_7c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_7c0.m_end = "";
  local_7d0.m_begin = "";
  local_7d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_7c0,0x3dc,&local_7d0);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_7d8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb.pimpl_.px)->readChunks_);
  ib.pimpl_.px = (element_type *)CONCAT44(ib.pimpl_.px._4_4_,(int)sVar1);
  local_950._0_4_ = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pBVar3,&local_7e0,0x3dc,1,2,&ib,"ib.numChunks()",&local_950,"0");
  local_7f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_7f0.m_end = "";
  local_800.m_begin = "";
  local_800.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_7f0,0x3dd,&local_800);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_808 = "";
  ib.pimpl_.px = (element_type *)(wb.pimpl_.px)->size_;
  local_950._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (pBVar3,&local_810,0x3dd,1,2,&ib,"ib.size()",&local_950,"0U");
  local_820.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_820.m_end = "";
  local_830.m_begin = "";
  local_830.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_820,0x3e0,&local_830);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_838 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(wb_3.pimpl_.px)->writeChunks_);
  ib.pimpl_.px = (element_type *)CONCAT44(ib.pimpl_.px._4_4_,(int)sVar1);
  local_950._0_4_ = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (pBVar3,&local_840,0x3e0,1,2,&ib,"wb.numChunks()",&local_950,"2");
  local_850.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_850.m_end = "";
  local_860.m_begin = "";
  local_860.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_850,0x3e1,&local_860);
  pBVar3 = &local_8e8;
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_868 = "";
  ib.pimpl_.px = (element_type *)(wb_3.pimpl_.px)->size_;
  local_950 = (ulong)local_950._4_4_ << 0x20;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (pBVar3,&local_870,0x3e1,1,2,&ib,"wb.size()",&local_950,"0U");
  local_880.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_880.m_end = "";
  local_890.m_begin = "";
  local_890.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pBVar3,&local_880,0x3e2,&local_890);
  local_8e8.bufferImpl_.pn.pi_ = local_8e8.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_8e8.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_8e8.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_8e8.iter_._M_first = (_Elt_pointer)0x1b9884;
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_898 = "";
  ib.pimpl_.px = (element_type *)(wb_3.pimpl_.px)->freeSpace_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_8e8,&local_8a0,0x3e2,1,2,&ib,"wb.freeSpace()",&bufsize,"bufsize");
  boost::detail::shared_count::~shared_count(&wb.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&wb_3.pimpl_.pn);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void TestCopy() 
{
    BOOST_TEST_MESSAGE( "TestCopy");

    const std::string msg = makeString(30);
    // Test1, small data, small buffer
    {
        std::cout << "Test1\n";
        // put a small amount of data in the buffer
        avro::OutputBuffer wb;

        wb.writeTo(msg.c_str(), msg.size());

        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 1);
        BOOST_CHECK_EQUAL(kDefaultBlockSize - msg.size(), 
                wb.freeSpace());

        // copy starting at offset 5 and copying 10 less bytes
        BufferReader br(wb);
        br.seek(5);
        avro::InputBuffer ib = br.copyData(msg.size() - 10);

        printBuffer(ib);

        BOOST_CHECK_EQUAL(ib.numChunks(), 1);
        BOOST_CHECK_EQUAL(ib.size(), msg.size()-10);

        // buf 1 should be unchanged
        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 1);
        BOOST_CHECK_EQUAL(kDefaultBlockSize - msg.size(), 
                wb.freeSpace());

        // make sure wb is still functional
        wb.reserve(kDefaultBlockSize);
        BOOST_CHECK_EQUAL(wb.size(), msg.size());
        BOOST_CHECK_EQUAL(wb.numChunks(), 2);
        BOOST_CHECK_EQUAL(kDefaultBlockSize * 2 - msg.size(), 
                wb.freeSpace());
    }

    // Test2, small data, large buffer
    {
        std::cout << "Test2\n";
        // put a small amount of data in the buffer
        const OutputBuffer::size_type bufsize= 3*kMaxBlockSize;

        avro::OutputBuffer wb(bufsize);
        BOOST_CHECK_EQUAL(wb.numChunks(), 3);
        BOOST_CHECK_EQUAL(wb.freeSpace(), bufsize);

        wb.writeTo(msg.c_str(), msg.size());

        BOOST_CHECK_EQUAL(wb.size(), msg.size());
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 1);
        BOOST_CHECK_EQUAL(bufsize - msg.size(), 
                wb.freeSpace());

        BufferReader br(wb);
        br.seek(5);
        avro::InputBuffer ib = br.copyData(msg.size() - 10);

        printBuffer(ib);

        BOOST_CHECK_EQUAL(ib.numChunks(), 1);
        BOOST_CHECK_EQUAL(ib.size(), msg.size()-10);

        // wb should be unchanged
        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numChunks(), 3);
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 1);
        BOOST_CHECK_EQUAL(bufsize - msg.size(), wb.freeSpace());

        // reserving a small amount should have no effect
        wb.reserve(1);
        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numChunks(), 3);
        BOOST_CHECK_EQUAL(bufsize - msg.size(), wb.freeSpace());

        // reserve more (will get extra block)
        wb.reserve(bufsize);
        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numChunks(), 4);
        BOOST_CHECK_EQUAL(kMaxBlockSize * 3 - msg.size() + kMinBlockSize, 
                wb.freeSpace());
    }

    // Test3 Border case, buffer is exactly full
    {
        std::cout << "Test3\n";
        const OutputBuffer::size_type bufsize= 2*kDefaultBlockSize;
        avro::OutputBuffer wb;

        for(unsigned i = 0; i < bufsize; ++i) {
            wb.writeTo('a');
        }

        BOOST_CHECK_EQUAL(wb.size(), bufsize);
        BOOST_CHECK_EQUAL(wb.freeSpace(), 0U);
        BOOST_CHECK_EQUAL(wb.numChunks(), 0);
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 2);

        // copy where the chunks overlap
        BufferReader br(wb);
        br.seek(bufsize/2 - 10);
        avro::InputBuffer ib = br.copyData(20);

        printBuffer(ib);

        BOOST_CHECK_EQUAL(ib.size(), 20U);
        BOOST_CHECK_EQUAL(ib.numChunks(), 2);

        // wb should be unchanged
        BOOST_CHECK_EQUAL(wb.size(), bufsize);
        BOOST_CHECK_EQUAL(wb.freeSpace(), 0U);
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 2);
    }

    // Test4, no data 
    {
        const OutputBuffer::size_type bufsize= 2*kMaxBlockSize;
        std::cout << "Test4\n";
        avro::OutputBuffer wb(bufsize);
        BOOST_CHECK_EQUAL(wb.numChunks(), 2);
        BOOST_CHECK_EQUAL(wb.size(), 0U);
        BOOST_CHECK_EQUAL(wb.freeSpace(), bufsize);

        avro::InputBuffer ib;
        try {
            BufferReader br(wb);
            br.seek(10);
        }
        catch (std::exception &e) {
            cout << "Intentially triggered exception: " << e.what() << endl;
        }
        try {
            BufferReader br(wb);
            avro::InputBuffer ib = br.copyData(10);
        }
        catch (std::exception &e) {
            cout << "Intentially triggered exception: " << e.what() << endl;
        }


        BOOST_CHECK_EQUAL(ib.numChunks(), 0);
        BOOST_CHECK_EQUAL(ib.size(), 0U);

        // wb should keep all blocks remaining
        BOOST_CHECK_EQUAL(wb.numChunks(), 2);
        BOOST_CHECK_EQUAL(wb.size(), 0U);
        BOOST_CHECK_EQUAL(wb.freeSpace(), bufsize);
    }
}